

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_switch_deviation(lys_deviation *dev,lys_module *module,unres_schema *unres)

{
  ly_ctx *plVar1;
  lys_module *plVar2;
  char *pcVar3;
  LYS_NODE LVar4;
  ly_set *local_50;
  ly_set *set;
  lys_node_inout *inout;
  lys_node *parent;
  lys_node *target;
  char *parent_path;
  int reapply;
  int ret;
  unres_schema *unres_local;
  lys_module *module_local;
  lys_deviation *dev_local;
  
  parent_path._0_4_ = 0;
  parent = (lys_node *)0x0;
  if (dev->deviate != (lys_deviate *)0x0) {
    _reapply = unres;
    unres_local = (unres_schema *)module;
    module_local = (lys_module *)dev;
    if (dev->deviate->mod == LY_DEVIATE_NO) {
      if (dev->orig_node == (lys_node *)0x0) {
        parent_path._4_4_ =
             resolve_schema_nodeid(dev->target_name,(lys_node *)0x0,module,&local_50,0,1);
        if (parent_path._4_4_ == -1) {
          ly_log((ly_ctx *)unres_local->item,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                 ,0x11b6);
          ly_set_free(local_50);
        }
        else {
          parent = *(local_50->set).s;
          ly_set_free(local_50);
          inout = (lys_node_inout *)parent->parent;
          lys_node_unlink(parent);
          if (inout != (lys_node_inout *)0x0) {
            if ((inout->nodetype & (LYS_AUGMENT|LYS_USES)) == LYS_UNKNOWN) {
              if ((inout->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
                set = (ly_set *)calloc(1,0x78);
                if (set == (ly_set *)0x0) {
                  ly_log((ly_ctx *)unres_local->item,LY_LLERR,LY_EMEM,
                         "Memory allocation failed (%s()).","lys_switch_deviation");
                  return;
                }
                *(LYS_NODE *)&set[3].set = parent->nodetype;
                pcVar3 = "output";
                if (*(int *)&set[3].set == 0x200) {
                  pcVar3 = "input";
                }
                pcVar3 = lydict_insert((ly_ctx *)unres_local->item,pcVar3,0);
                *(char **)set = pcVar3;
                *(lys_module **)(set + 3) = parent->module;
                *(undefined2 *)&set[1].set = 0x40;
                if ((inout->child == (lys_node *)0x0) || (inout->child->next != (lys_node *)0x0)) {
LAB_00194331:
                  __assert_fail("parent->child && !parent->child->next && (parent->child->nodetype == (inout->nodetype == LYS_INPUT ? LYS_OUTPUT : LYS_INPUT))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                                ,0x11d3,
                                "void lys_switch_deviation(struct lys_deviation *, const struct lys_module *, struct unres_schema *)"
                               );
                }
                LVar4 = LYS_INPUT;
                if (*(int *)&set[3].set == 0x200) {
                  LVar4 = LYS_OUTPUT;
                }
                if (inout->child->nodetype != LVar4) goto LAB_00194331;
                inout->child->next = (lys_node *)set;
                set[5].set = (ly_set_set)inout->child;
                inout->child->prev = (lys_node *)set;
                *(lys_node_inout **)(set + 4) = inout;
              }
            }
            else {
              parent->parent = (lys_node *)inout;
            }
          }
          module_local->dsc = (char *)parent;
        }
      }
      else {
        plVar1 = (ly_ctx *)strrchr(dev->target_name,0x2f);
        if (plVar1 == module_local->ctx) {
          plVar2 = lys_node_module((lys_node *)module_local->dsc);
          lys_node_addchild((lys_node *)0x0,plVar2,(lys_node *)module_local->dsc,0);
        }
        else {
          inout = *(lys_node_inout **)(module_local->dsc + 0x40);
          if ((inout == (lys_node_inout *)0x0) || (inout->nodetype != LYS_AUGMENT)) {
            if ((inout == (lys_node_inout *)0x0) || (inout->nodetype != LYS_USES)) {
              plVar1 = module_local->ctx;
              pcVar3 = strrchr((char *)module_local->ctx,0x2f);
              target = (lys_node *)strndup((char *)plVar1,(long)pcVar3 - (long)module_local->ctx);
              parent_path._4_4_ =
                   resolve_schema_nodeid
                             ((char *)target,(lys_node *)0x0,(lys_module *)unres_local,&local_50,0,1
                             );
              free(target);
              if (parent_path._4_4_ == -1) {
                ly_log((ly_ctx *)unres_local->item,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                       ,0x11a3);
                ly_set_free(local_50);
                return;
              }
              parent = *(local_50->set).s;
              ly_set_free(local_50);
              lys_node_addchild(parent,(lys_module *)0x0,(lys_node *)module_local->dsc,0);
            }
            else {
              lys_node_addchild((lys_node *)inout,(lys_module *)0x0,(lys_node *)module_local->dsc,0)
              ;
            }
          }
          else {
            pcVar3 = module_local->dsc;
            pcVar3[0x40] = '\0';
            pcVar3[0x41] = '\0';
            pcVar3[0x42] = '\0';
            pcVar3[0x43] = '\0';
            pcVar3[0x44] = '\0';
            pcVar3[0x45] = '\0';
            pcVar3[0x46] = '\0';
            pcVar3[0x47] = '\0';
            if ((inout->flags & 1) == 0) {
              remove_aug((lys_node_augment *)inout);
              parent_path._0_4_ = 1;
            }
            lys_node_addchild((lys_node *)inout,(lys_module *)0x0,(lys_node *)module_local->dsc,0);
            if ((int)parent_path != 0) {
              plVar2 = lys_node_module((lys_node *)inout);
              if ((*(ushort *)&plVar2->field_0x40 >> 7 & 1) == 0) {
                __assert_fail("lys_node_module(parent)->implemented",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                              ,0x1196,
                              "void lys_switch_deviation(struct lys_deviation *, const struct lys_module *, struct unres_schema *)"
                             );
              }
              inout->flags = inout->flags | 1;
              apply_aug((lys_node_augment *)inout,_reapply);
            }
          }
        }
        module_local->dsc = (char *)0x0;
      }
    }
    else {
      parent_path._4_4_ =
           resolve_schema_nodeid(dev->target_name,(lys_node *)0x0,module,&local_50,0,1);
      if (parent_path._4_4_ == -1) {
        ly_log((ly_ctx *)unres_local->item,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
               ,0x11df);
        ly_set_free(local_50);
      }
      else {
        parent = *(local_50->set).s;
        ly_set_free(local_50);
        lys_node_switch(parent,(lys_node *)module_local->dsc);
      }
    }
  }
  return;
}

Assistant:

static void
lys_switch_deviation(struct lys_deviation *dev, const struct lys_module *module, struct unres_schema *unres)
{
    int ret, reapply = 0;
    char *parent_path;
    struct lys_node *target = NULL, *parent;
    struct lys_node_inout *inout;
    struct ly_set *set;

    if (!dev->deviate) {
        return;
    }

    if (dev->deviate[0].mod == LY_DEVIATE_NO) {
        if (dev->orig_node) {
            /* removing not-supported deviation ... */
            if (strrchr(dev->target_name, '/') != dev->target_name) {
                /* ... from a parent */

                /* reconnect to its previous position */
                parent = dev->orig_node->parent;
                if (parent && (parent->nodetype == LYS_AUGMENT)) {
                    dev->orig_node->parent = NULL;
                    /* the original node was actually from augment, we have to get know if the augment is
                     * applied (its module is enabled and implemented). If yes, the node will be connected
                     * to the augment and the linkage with the target will be fixed if needed, otherwise
                     * it will be connected only to the augment */
                    if (!(parent->flags & LYS_NOTAPPLIED)) {
                        /* start with removing augment if applied before adding nodes, we have to make sure
                         * that everything will be connect correctly */
                        remove_aug((struct lys_node_augment *)parent);
                        reapply = 1;
                    }
                    /* connect the deviated node back into the augment */
                    lys_node_addchild(parent, NULL, dev->orig_node, 0);
                    if (reapply) {
                        /* augment is supposed to be applied, so fix pointers in target and the status of the original node */
                        assert(lys_node_module(parent)->implemented);
                        parent->flags |= LYS_NOTAPPLIED; /* allow apply_aug() */
                        apply_aug((struct lys_node_augment *)parent, unres);
                    }
                } else if (parent && (parent->nodetype == LYS_USES)) {
                    /* uses child */
                    lys_node_addchild(parent, NULL, dev->orig_node, 0);
                } else {
                    /* non-augment, non-toplevel */
                    parent_path = strndup(dev->target_name, strrchr(dev->target_name, '/') - dev->target_name);
                    ret = resolve_schema_nodeid(parent_path, NULL, module, &set, 0, 1);
                    free(parent_path);
                    if (ret == -1) {
                        LOGINT(module->ctx);
                        ly_set_free(set);
                        return;
                    }
                    target = set->set.s[0];
                    ly_set_free(set);

                    lys_node_addchild(target, NULL, dev->orig_node, 0);
                }
            } else {
                /* ... from top-level data */
                lys_node_addchild(NULL, lys_node_module(dev->orig_node), dev->orig_node, 0);
            }

            dev->orig_node = NULL;
        } else {
            /* adding not-supported deviation */
            ret = resolve_schema_nodeid(dev->target_name, NULL, module, &set, 0, 1);
            if (ret == -1) {
                LOGINT(module->ctx);
                ly_set_free(set);
                return;
            }
            target = set->set.s[0];
            ly_set_free(set);

            /* unlink and store the original node */
            parent = target->parent;
            lys_node_unlink(target);
            if (parent) {
                if (parent->nodetype & (LYS_AUGMENT | LYS_USES)) {
                    /* hack for augment, because when the original will be sometime reconnected back, we actually need
                     * to reconnect it to both - the augment and its target (which is deduced from the deviations target
                     * path), so we need to remember the augment as an addition */
                    /* we also need to remember the parent uses so that we connect it back to it when switching deviation state */
                    target->parent = parent;
                } else if (parent->nodetype & (LYS_RPC | LYS_ACTION)) {
                    /* re-create implicit node */
                    inout = calloc(1, sizeof *inout);
                    LY_CHECK_ERR_RETURN(!inout, LOGMEM(module->ctx), );

                    inout->nodetype = target->nodetype;
                    inout->name = lydict_insert(module->ctx, (inout->nodetype == LYS_INPUT) ? "input" : "output", 0);
                    inout->module = target->module;
                    inout->flags = LYS_IMPLICIT;

                    /* insert it manually */
                    assert(parent->child && !parent->child->next
                    && (parent->child->nodetype == (inout->nodetype == LYS_INPUT ? LYS_OUTPUT : LYS_INPUT)));
                    parent->child->next = (struct lys_node *)inout;
                    inout->prev = parent->child;
                    parent->child->prev = (struct lys_node *)inout;
                    inout->parent = parent;
                }
            }
            dev->orig_node = target;
        }
    } else {
        ret = resolve_schema_nodeid(dev->target_name, NULL, module, &set, 0, 1);
        if (ret == -1) {
            LOGINT(module->ctx);
            ly_set_free(set);
            return;
        }
        target = set->set.s[0];
        ly_set_free(set);

        /* contents are switched */
        lys_node_switch(target, dev->orig_node);
    }
}